

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTestPackages.cpp
# Opt level: O0

int __thiscall gl4cts::GL45TestPackage::init(GL45TestPackage *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  ClipControlTests *this_00;
  Context *pCVar1;
  TestNode *pTVar2;
  TextureBarrierTests *this_01;
  GL45TestPackage *this_local;
  
  GL44TestPackage::init(&this->super_GL44TestPackage,ctx);
  this_00 = (ClipControlTests *)operator_new(0x80);
  pCVar1 = deqp::TestPackage::getContext((TestPackage *)this);
  ClipControlTests::ClipControlTests(this_00,pCVar1,API_GL_45core);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = deqp::TestPackage::getContext((TestPackage *)this);
  DirectStateAccess::Tests::Tests((Tests *)pTVar2,pCVar1);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = deqp::TestPackage::getContext((TestPackage *)this);
  GetTextureSubImage::Tests::Tests((Tests *)pTVar2,pCVar1);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = deqp::TestPackage::getContext((TestPackage *)this);
  RobustnessTests::RobustnessTests((RobustnessTests *)pTVar2,pCVar1);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  this_01 = (TextureBarrierTests *)operator_new(0x80);
  pCVar1 = deqp::TestPackage::getContext((TestPackage *)this);
  TextureBarrierTests::TextureBarrierTests(this_01,pCVar1,API_GL_45core);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = deqp::TestPackage::getContext((TestPackage *)this);
  ConditionalRenderInverted::Tests::Tests((Tests *)pTVar2,pCVar1);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = deqp::TestPackage::getContext((TestPackage *)this);
  Sync::Tests::Tests((Tests *)pTVar2,pCVar1);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = deqp::TestPackage::getContext((TestPackage *)this);
  IncompleteTextureAccess::Tests::Tests((Tests *)pTVar2,pCVar1);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = deqp::TestPackage::getContext((TestPackage *)this);
  ParallelShaderCompileTests::ParallelShaderCompileTests
            ((ParallelShaderCompileTests *)pTVar2,pCVar1);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = deqp::TestPackage::getContext((TestPackage *)this);
  PostDepthCoverage::PostDepthCoverage((PostDepthCoverage *)pTVar2,pCVar1);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = deqp::TestPackage::getContext((TestPackage *)this);
  SparseTexture2Tests::SparseTexture2Tests((SparseTexture2Tests *)pTVar2,pCVar1);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = deqp::TestPackage::getContext((TestPackage *)this);
  SparseTextureClampTests::SparseTextureClampTests((SparseTextureClampTests *)pTVar2,pCVar1);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = deqp::TestPackage::getContext((TestPackage *)this);
  TextureFilterMinmax::TextureFilterMinmax((TextureFilterMinmax *)pTVar2,pCVar1);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void GL45TestPackage::init(void)
{
	// Call init() in parent - this creates context.
	GL44TestPackage::init();

	try
	{
		addChild(new gl4cts::ClipControlTests(getContext(), gl4cts::ClipControlTests::API_GL_45core));
		addChild(new gl4cts::DirectStateAccess::Tests(getContext()));
		addChild(new gl4cts::GetTextureSubImage::Tests(getContext()));
		addChild(new gl4cts::RobustnessTests(getContext()));
		addChild(new gl4cts::TextureBarrierTests(getContext(), gl4cts::TextureBarrierTests::API_GL_45core));
		addChild(new gl4cts::ConditionalRenderInverted::Tests(getContext()));
		addChild(new gl4cts::Sync::Tests(getContext()));
		addChild(new gl4cts::IncompleteTextureAccess::Tests(getContext()));
		addChild(new gl4cts::ParallelShaderCompileTests(getContext()));
		addChild(new gl4cts::PostDepthCoverage(getContext()));
		addChild(new gl4cts::SparseTexture2Tests(getContext()));
		addChild(new gl4cts::SparseTextureClampTests(getContext()));
		addChild(new gl4cts::TextureFilterMinmax(getContext()));
	}
	catch (...)
	{
		// Destroy context.
		TestPackage::deinit();
		throw;
	}
}